

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

SN_ELEMENT * __thiscall ON_SerialNumberMap::AddSerialNumber(ON_SerialNumberMap *this,ON__UINT64 sn)

{
  ON__UINT32 *pOVar1;
  uint uVar2;
  ON_SN_BLOCK *pOVar3;
  ON_SerialNumberMapPrivate *pOVar4;
  SN_ELEMENT *pSVar5;
  
  if (sn == 0) {
    return (SN_ELEMENT *)0x0;
  }
  pSVar5 = FindElementHelper(this,sn);
  if (pSVar5 == (SN_ELEMENT *)0x0) {
    if (this->m_sn_block0->m_count == 0x2000) {
      GarbageCollectHelper(this);
    }
    pOVar3 = this->m_sn_block0;
    uVar2 = pOVar3->m_count;
    if ((ulong)uVar2 == 0) {
      pOVar3->m_sn1 = sn;
      pOVar3->m_sn0 = sn;
      pOVar3->m_sorted = 1;
    }
    else if (pOVar3->m_sn1 < sn) {
      pOVar3->m_sn1 = sn;
    }
    else {
      if (sn < pOVar3->m_sn0) {
        pOVar3->m_sn0 = sn;
      }
      pOVar3->m_sorted = 0;
    }
    pOVar4 = this->m_private;
    if ((pOVar4->m_maxsn < sn) && (pOVar4->m_maxsn = sn, sn < 0xffffffff)) {
      pOVar4->m_lower_maxsn = sn;
    }
    if (((sn < 0xffffffff) && (pOVar4->m_lower_maxsn < sn)) &&
       (pOVar4->m_lower_maxsn = sn, pOVar4->m_maxsn < sn)) {
      pOVar4->m_maxsn = sn;
    }
    this->m_sn_count = this->m_sn_count + 1;
    pOVar3->m_count = uVar2 + 1;
    pSVar5 = pOVar3->m_sn + uVar2;
  }
  else {
    if (pSVar5->m_sn_active != '\0') {
      return pSVar5;
    }
    this->m_sn_purged = this->m_sn_purged - 1;
    pOVar1 = &this->m_e_blk->m_purged;
    *pOVar1 = *pOVar1 - 1;
  }
  pSVar5->m_sn = 0;
  pSVar5->m_sn_active = '\0';
  pSVar5->m_id_active = '\0';
  pSVar5->m_reserved1 = '\0';
  pSVar5->m_reserved2 = '\0';
  pSVar5->m_id_crc32 = 0;
  pSVar5->m_next = (SN_ELEMENT *)0x0;
  (pSVar5->m_value).m_u_type = 0;
  (pSVar5->m_value).m_u32 = 0;
  (pSVar5->m_id).Data1 = 0;
  (pSVar5->m_id).Data2 = 0;
  (pSVar5->m_id).Data3 = 0;
  (pSVar5->m_id).Data4[0] = '\0';
  (pSVar5->m_id).Data4[1] = '\0';
  (pSVar5->m_id).Data4[2] = '\0';
  (pSVar5->m_id).Data4[3] = '\0';
  (pSVar5->m_id).Data4[4] = '\0';
  (pSVar5->m_id).Data4[5] = '\0';
  (pSVar5->m_id).Data4[6] = '\0';
  (pSVar5->m_id).Data4[7] = '\0';
  (pSVar5->m_value).m_u.u64 = 0;
  pSVar5->m_sn = sn;
  pSVar5->m_sn_active = '\x01';
  return pSVar5;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::AddSerialNumber(ON__UINT64 sn)
{
  if ( sn <= 0 )
    return 0;
  struct SN_ELEMENT* e = FindElementHelper(sn);
  if ( e )
  {
    if ( 0 == e->m_sn_active )
    {
      m_sn_purged--;
      m_e_blk->m_purged--;
      memset(e,0,sizeof(*e));
      e->m_sn = sn;
      e->m_sn_active = 1;
    }
  }
  else
  {
    if ( ON_SN_BLOCK::SN_BLOCK_CAPACITY == m_sn_block0.m_count )
    {
      // make room in m_sn_block0 for the new serial number
      GarbageCollectHelper();    
    }

    if ( 0 == m_sn_block0.m_count )
    {
      m_sn_block0.m_sn0 = m_sn_block0.m_sn1 = sn;
      m_sn_block0.m_sorted = 1;
    }
    else
    {
      if ( sn > m_sn_block0.m_sn1 )
      {
        m_sn_block0.m_sn1 = sn;
      }
      else
      {
        if ( sn < m_sn_block0.m_sn0 )
          m_sn_block0.m_sn0 = sn;
        m_sn_block0.m_sorted = 0;
      }        
    }
    if ( sn > m_private->MaxSn() )
      m_private->SetMaxSn(sn);
    if (sn < UINT32_MAX && sn > m_private->LowerMaxSn())
      m_private->SetLowerMaxSn(sn);

    m_sn_count++;
    e = &m_sn_block0.m_sn[m_sn_block0.m_count++];
    memset(e,0,sizeof(*e));
    e->m_sn = sn;
    e->m_sn_active = 1;
  }

  return e;
}